

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::ValueTranslator::fillStructValue
          (ValueTranslator *this,Builder builder,Reader assignments)

{
  int *__return_storage_ptr__;
  ErrorReporter *pEVar1;
  Reader src;
  Builder builder_00;
  Field field_00;
  Reader assignments_00;
  bool bVar2;
  Which WVar3;
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar4;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> *other_00;
  Orphan<capnp::DynamicValue> *pOVar5;
  char (*params) [20];
  char (*in_R8) [3];
  Iterator IVar6;
  StringPtr name;
  Type type;
  ArrayPtr<const_char> AVar7;
  String local_468;
  ArrayPtr<const_char> local_450;
  Reader local_440;
  ArrayPtr<const_char> local_410;
  String local_400;
  ArrayPtr<const_char> local_3e8;
  ArrayPtr<const_char> local_3d8;
  Reader local_3c8;
  RawBrandedSchema *local_398;
  undefined8 uStack_390;
  SegmentReader *local_388;
  CapTableReader *pCStack_380;
  void *local_378;
  WirePointer *pWStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  Builder local_358;
  BuilderFor<capnp::DynamicStruct> local_318;
  RawBrandedSchema *local_2e8;
  undefined8 uStack_2e0;
  SegmentReader *local_2d8;
  CapTableReader *pCStack_2d0;
  void *local_2c8;
  WirePointer *pWStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  Type local_2a8;
  word *local_298;
  SegmentReader *pSStack_290;
  CapTableReader *local_288;
  void *pvStack_280;
  WirePointer *local_278;
  StructDataBitCount SStack_270;
  StructPointerCount SStack_26c;
  undefined2 uStack_26a;
  Maybe<capnp::Orphan<capnp::DynamicValue>_> local_268;
  undefined1 local_228 [8];
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> compiledValue;
  Reader value;
  Reader fieldProto;
  Schema local_150;
  Maybe<capnp::StructSchema::Field> local_148;
  undefined1 local_100 [8];
  NullableValue<capnp::StructSchema::Field> field;
  Reader fieldName;
  Reader assignment;
  undefined1 local_48 [8];
  Iterator __end2;
  undefined1 local_28 [8];
  Iterator __begin2;
  Reader *__range2;
  ValueTranslator *this_local;
  
  __begin2._8_8_ = &assignments;
  IVar6 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)__begin2._8_8_);
  __end2._8_8_ = IVar6.container;
  __begin2.container._0_4_ = IVar6.index;
  local_28 = (undefined1  [8])__end2._8_8_;
  IVar6 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::end
                    ((Reader *)__begin2._8_8_);
  local_48 = (undefined1  [8])IVar6.container;
  __end2.container._0_4_ = IVar6.index;
  while( true ) {
    bVar2 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
            ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                          *)local_28,
                         (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                          *)local_48);
    if (!bVar2) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator*((Reader *)&fieldName._reader.nestingLimit,
                (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                 *)local_28);
    bVar2 = Expression::Param::Reader::isNamed((Reader *)&fieldName._reader.nestingLimit);
    if (bVar2) {
      __return_storage_ptr__ = &field.field_1.value.proto._reader.nestingLimit;
      Expression::Param::Reader::getNamed
                ((Reader *)__return_storage_ptr__,(Reader *)&fieldName._reader.nestingLimit);
      local_150.raw = (RawBrandedSchema *)DynamicStruct::Builder::getSchema(&builder);
      name.content = (ArrayPtr<const_char>)
                     LocatedText::Reader::getValue((Reader *)__return_storage_ptr__);
      StructSchema::findFieldByName(&local_148,(StructSchema *)&local_150,name);
      other = kj::_::readMaybe<capnp::StructSchema::Field>(&local_148);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_100,other);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_148);
      pFVar4 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_100);
      if (pFVar4 == (Field *)0x0) {
        pEVar1 = this->errorReporter;
        AVar7 = (ArrayPtr<const_char>)
                LocatedText::Reader::getValue
                          ((Reader *)&field.field_1.value.proto._reader.nestingLimit);
        local_410 = AVar7;
        kj::str<char_const(&)[28],capnp::Text::Reader,char_const(&)[3]>
                  (&local_400,(kj *)"Struct has no field named \'",(char (*) [28])&local_410,
                   (Reader *)0xace415,in_R8);
        kj::StringPtr::StringPtr((StringPtr *)&local_3e8,&local_400);
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar1,(Reader *)&field.field_1.value.proto._reader.nestingLimit,
                   (StringPtr)local_3e8);
        kj::String::~String(&local_400);
      }
      else {
        pFVar4 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                           ((NullableValue<capnp::StructSchema::Field> *)local_100);
        StructSchema::Field::getProto((Reader *)&value._reader.nestingLimit,pFVar4);
        Expression::Param::Reader::getValue
                  ((Reader *)&compiledValue.field_1.value.builder.location,
                   (Reader *)&fieldName._reader.nestingLimit);
        WVar3 = capnp::schema::Field::Reader::which((Reader *)&value._reader.nestingLimit);
        if (WVar3 == SLOT) {
          local_278 = value._reader.pointers;
          SStack_270 = value._reader.dataSize;
          SStack_26c = value._reader.pointerCount;
          uStack_26a = value._reader._38_2_;
          local_288 = value._reader.capTable;
          pvStack_280 = value._reader.data;
          local_298 = compiledValue.field_1.value.builder.location;
          pSStack_290 = value._reader.segment;
          pFVar4 = kj::_::NullableValue<capnp::StructSchema::Field>::operator->
                             ((NullableValue<capnp::StructSchema::Field> *)local_100);
          type = StructSchema::Field::getType(pFVar4);
          src._reader.capTable = (CapTableReader *)pSStack_290;
          src._reader.segment = (SegmentReader *)local_298;
          src._reader.data = local_288;
          src._reader.pointers = (WirePointer *)pvStack_280;
          src._reader._32_8_ = local_278;
          src._reader.nestingLimit = SStack_270;
          src._reader._44_2_ = SStack_26c;
          src._reader._46_2_ = uStack_26a;
          local_2a8 = type;
          compileValue(&local_268,this,src,type);
          other_00 = kj::_::readMaybe<capnp::Orphan<capnp::DynamicValue>>(&local_268);
          kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
                    ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_228,other_00);
          kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::~Maybe(&local_268);
          pOVar5 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_228);
          if (pOVar5 != (Orphan<capnp::DynamicValue> *)0x0) {
            pFVar4 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                               ((NullableValue<capnp::StructSchema::Field> *)local_100);
            local_2e8 = (pFVar4->parent).super_Schema.raw;
            uStack_2e0 = *(undefined8 *)&pFVar4->index;
            local_2d8 = (pFVar4->proto)._reader.segment;
            pCStack_2d0 = (pFVar4->proto)._reader.capTable;
            local_2c8 = (pFVar4->proto)._reader.data;
            pWStack_2c0 = (pFVar4->proto)._reader.pointers;
            local_2b8._0_4_ = (pFVar4->proto)._reader.dataSize;
            local_2b8._4_2_ = (pFVar4->proto)._reader.pointerCount;
            local_2b8._6_2_ = *(undefined2 *)&(pFVar4->proto)._reader.field_0x26;
            uStack_2b0 = *(undefined8 *)&(pFVar4->proto)._reader.nestingLimit;
            pOVar5 = kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::operator*
                               ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_228);
            pOVar5 = kj::mv<capnp::Orphan<capnp::DynamicValue>>(pOVar5);
            field_00._8_8_ = uStack_2e0;
            field_00.parent.super_Schema.raw = (Schema)(Schema)local_2e8;
            field_00.proto._reader.segment = local_2d8;
            field_00.proto._reader.capTable = pCStack_2d0;
            field_00.proto._reader.data = local_2c8;
            field_00.proto._reader.pointers = pWStack_2c0;
            field_00.proto._reader.dataSize = (undefined4)local_2b8;
            field_00.proto._reader.pointerCount = local_2b8._4_2_;
            field_00.proto._reader._38_2_ = local_2b8._6_2_;
            field_00.proto._reader._40_8_ = uStack_2b0;
            DynamicStruct::Builder::adopt(&builder,field_00,pOVar5);
          }
          kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
                    ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_228);
        }
        else if (WVar3 == GROUP) {
          bVar2 = Expression::Reader::isTuple
                            ((Reader *)&compiledValue.field_1.value.builder.location);
          if (bVar2) {
            pFVar4 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                               ((NullableValue<capnp::StructSchema::Field> *)local_100);
            local_398 = (pFVar4->parent).super_Schema.raw;
            uStack_390 = *(undefined8 *)&pFVar4->index;
            local_388 = (pFVar4->proto)._reader.segment;
            pCStack_380 = (pFVar4->proto)._reader.capTable;
            local_378 = (pFVar4->proto)._reader.data;
            pWStack_370 = (pFVar4->proto)._reader.pointers;
            local_368._0_4_ = (pFVar4->proto)._reader.dataSize;
            local_368._4_2_ = (pFVar4->proto)._reader.pointerCount;
            local_368._6_2_ = *(undefined2 *)&(pFVar4->proto)._reader.field_0x26;
            uStack_360 = *(undefined8 *)&(pFVar4->proto)._reader.nestingLimit;
            DynamicStruct::Builder::init((Builder *)&local_358,(EVP_PKEY_CTX *)&builder);
            DynamicValue::Builder::as<capnp::DynamicStruct>(&local_318,&local_358);
            Expression::Reader::getTuple
                      (&local_3c8,(Reader *)&compiledValue.field_1.value.builder.location);
            builder_00.builder.segment = local_318.builder.segment;
            builder_00.schema.super_Schema.raw = local_318.schema.super_Schema.raw;
            builder_00.builder.capTable = local_318.builder.capTable;
            builder_00.builder.data = local_318.builder.data;
            builder_00.builder.pointers = local_318.builder.pointers;
            builder_00.builder.dataSize = local_318.builder.dataSize;
            builder_00.builder.pointerCount = local_318.builder.pointerCount;
            builder_00.builder._38_2_ = local_318.builder._38_2_;
            assignments_00.reader.capTable = local_3c8.reader.capTable;
            assignments_00.reader.segment = local_3c8.reader.segment;
            assignments_00.reader.ptr = local_3c8.reader.ptr;
            assignments_00.reader.elementCount = local_3c8.reader.elementCount;
            assignments_00.reader.step = local_3c8.reader.step;
            assignments_00.reader.structDataSize = local_3c8.reader.structDataSize;
            assignments_00.reader.structPointerCount = local_3c8.reader.structPointerCount;
            assignments_00.reader.elementSize = local_3c8.reader.elementSize;
            assignments_00.reader._39_1_ = local_3c8.reader._39_1_;
            assignments_00.reader.nestingLimit = local_3c8.reader.nestingLimit;
            assignments_00.reader._44_4_ = local_3c8.reader._44_4_;
            fillStructValue(this,builder_00,assignments_00);
            DynamicValue::Builder::~Builder(&local_358);
          }
          else {
            pEVar1 = this->errorReporter;
            kj::StringPtr::StringPtr((StringPtr *)&local_3d8,"Type mismatch; expected group.");
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                      (pEVar1,(Reader *)&compiledValue.field_1.value.builder.location,
                       (StringPtr)local_3d8);
          }
        }
      }
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_100);
    }
    else {
      pEVar1 = this->errorReporter;
      Expression::Param::Reader::getValue(&local_440,(Reader *)&fieldName._reader.nestingLimit);
      kj::str<char_const(&)[20]>(&local_468,(kj *)"Missing field name.",params);
      kj::StringPtr::StringPtr((StringPtr *)&local_450,&local_468);
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>
                (pEVar1,&local_440,(StringPtr)local_450);
      kj::String::~String(&local_468);
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                  *)local_28);
  }
  return;
}

Assistant:

void ValueTranslator::fillStructValue(DynamicStruct::Builder builder,
                                      List<Expression::Param>::Reader assignments) {
  for (auto assignment: assignments) {
    if (assignment.isNamed()) {
      auto fieldName = assignment.getNamed();
      KJ_IF_MAYBE(field, builder.getSchema().findFieldByName(fieldName.getValue())) {
        auto fieldProto = field->getProto();
        auto value = assignment.getValue();

        switch (fieldProto.which()) {
          case schema::Field::SLOT:
            KJ_IF_MAYBE(compiledValue, compileValue(value, field->getType())) {
              builder.adopt(*field, kj::mv(*compiledValue));
            }
            break;

          case schema::Field::GROUP:
            if (value.isTuple()) {
              fillStructValue(builder.init(*field).as<DynamicStruct>(), value.getTuple());
            } else {
              errorReporter.addErrorOn(value, "Type mismatch; expected group.");
            }
            break;
        }
      } else {
        errorReporter.addErrorOn(fieldName, kj::str(
            "Struct has no field named '", fieldName.getValue(), "'."));
      }
    } else {
      errorReporter.addErrorOn(assignment.getValue(), kj::str("Missing field name."));
    }
  }
}